

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O0

void __thiscall cmGhsMultiTargetGenerator::GenerateTarget(cmGhsMultiTargetGenerator *this)

{
  string *psVar1;
  cmGlobalGhsMultiGenerator *this_00;
  undefined1 local_2a8 [8];
  string language;
  cmGeneratedFileStream fout;
  undefined1 local_30 [8];
  string fproj;
  cmGhsMultiTargetGenerator *this_local;
  
  fproj.field_2._8_8_ = this;
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     (&this->LocalGenerator->super_cmLocalGenerator);
  std::__cxx11::string::string((string *)local_30,(string *)psVar1);
  std::__cxx11::string::operator+=((string *)local_30,"/");
  std::__cxx11::string::operator+=((string *)local_30,(string *)&this->Name);
  std::__cxx11::string::operator+=((string *)local_30,cmGlobalGhsMultiGenerator::FILE_EXTENSION);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)((long)&language.field_2 + 8),(string *)local_30,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent
            ((cmGeneratedFileStream *)((long)&language.field_2 + 8),true);
  this_00 = GetGlobalGenerator(this);
  cmGlobalGhsMultiGenerator::WriteFileHeader(this_00,(ostream *)((long)&language.field_2 + 8));
  GhsMultiGpj::WriteGpjTag(this->TagType,(ostream *)((long)&language.field_2 + 8));
  if (this->TagType != CUSTOM_TARGET) {
    cmGeneratorTarget::GetLinkerLanguage
              ((string *)local_2a8,this->GeneratorTarget,&this->ConfigName);
    WriteTargetSpecifics(this,(ostream *)((long)&language.field_2 + 8),&this->ConfigName);
    SetCompilerFlags(this,&this->ConfigName,(string *)local_2a8);
    WriteCompilerFlags(this,(ostream *)((long)&language.field_2 + 8),&this->ConfigName,
                       (string *)local_2a8);
    WriteCompilerDefinitions
              (this,(ostream *)((long)&language.field_2 + 8),&this->ConfigName,(string *)local_2a8);
    WriteIncludes(this,(ostream *)((long)&language.field_2 + 8),&this->ConfigName,
                  (string *)local_2a8);
    WriteTargetLinkLine(this,(ostream *)((long)&language.field_2 + 8),&this->ConfigName);
    WriteBuildEvents(this,(ostream *)((long)&language.field_2 + 8));
    std::__cxx11::string::~string((string *)local_2a8);
  }
  WriteSources(this,(ostream *)((long)&language.field_2 + 8));
  cmGeneratedFileStream::Close((cmGeneratedFileStream *)((long)&language.field_2 + 8));
  cmGeneratedFileStream::~cmGeneratedFileStream
            ((cmGeneratedFileStream *)((long)&language.field_2 + 8));
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::GenerateTarget()
{
  // Open the target file in copy-if-different mode.
  std::string fproj = this->LocalGenerator->GetCurrentBinaryDirectory();
  fproj += "/";
  fproj += this->Name;
  fproj += cmGlobalGhsMultiGenerator::FILE_EXTENSION;
  cmGeneratedFileStream fout(fproj);
  fout.SetCopyIfDifferent(true);

  this->GetGlobalGenerator()->WriteFileHeader(fout);
  GhsMultiGpj::WriteGpjTag(this->TagType, fout);

  if (this->TagType != GhsMultiGpj::CUSTOM_TARGET) {
    const std::string language(
      this->GeneratorTarget->GetLinkerLanguage(this->ConfigName));
    this->WriteTargetSpecifics(fout, this->ConfigName);
    this->SetCompilerFlags(this->ConfigName, language);
    this->WriteCompilerFlags(fout, this->ConfigName, language);
    this->WriteCompilerDefinitions(fout, this->ConfigName, language);
    this->WriteIncludes(fout, this->ConfigName, language);
    this->WriteTargetLinkLine(fout, this->ConfigName);
    this->WriteBuildEvents(fout);
  }
  this->WriteSources(fout);
  fout.Close();
}